

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_xref.cc
# Opt level: O2

int OBJ_find_sigid_algs(int signid,int *pdig_nid,int *ppkey_nid)

{
  nid_triple *pnVar1;
  ulong uVar2;
  nid_triple *pnVar3;
  ulong uVar4;
  
  pnVar1 = kTriples;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    pnVar3 = pnVar1;
    if (uVar4 == 0x12) goto LAB_00209263;
    pnVar1 = pnVar3 + 1;
    uVar2 = uVar4 + 1;
  } while (pnVar3->sign_nid != signid);
  if (pdig_nid != (int *)0x0) {
    *pdig_nid = pnVar3->digest_nid;
  }
  if (ppkey_nid != (int *)0x0) {
    *ppkey_nid = pnVar3->pkey_nid;
  }
LAB_00209263:
  return (int)(uVar4 < 0x12);
}

Assistant:

int OBJ_find_sigid_algs(int sign_nid, int *out_digest_nid, int *out_pkey_nid) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTriples); i++) {
    if (kTriples[i].sign_nid == sign_nid) {
      if (out_digest_nid != NULL) {
        *out_digest_nid = kTriples[i].digest_nid;
      }
      if (out_pkey_nid != NULL) {
        *out_pkey_nid = kTriples[i].pkey_nid;
      }
      return 1;
    }
  }

  return 0;
}